

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  long lVar1;
  SerialArena *this_00;
  long *in_FS_OFFSET;
  bool bVar2;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar3;
  
  if (((byte)this[8] & 2) == 0) {
    lVar1 = *in_FS_OFFSET;
    if (*(long *)(lVar1 + -0x38) == *(long *)this) {
      this_00 = *(SerialArena **)(lVar1 + -0x30);
      bVar2 = true;
    }
    else {
      this_00 = *(SerialArena **)(this + 0x18);
      if (this_00 == (SerialArena *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = this_00->owner_ == (void *)(lVar1 + -0x40);
      }
    }
    if (bVar2) {
      pVar3 = SerialArena::AllocateAlignedWithCleanup
                        (this_00,n,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
      return pVar3;
    }
  }
  pVar3 = AllocateAlignedWithCleanupFallback(this,n,type);
  return pVar3;
}

Assistant:

std::pair<void*, SerialArena::CleanupNode*>
ThreadSafeArena::AllocateAlignedWithCleanup(size_t n,
                                            const std::type_info* type) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(!alloc_policy_.should_record_allocs() &&
                            GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, alloc_policy_.get());
  } else {
    return AllocateAlignedWithCleanupFallback(n, type);
  }
}